

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URDFModelExport.cpp
# Opt level: O2

bool iDynTree::exportTransform(Transform *trans,xmlNodePtr parent_element)

{
  bool bVar1;
  undefined8 uVar2;
  Position *in;
  string pose_rpy_str;
  string pose_xyz_str;
  Vector3 pose_rpy;
  string local_70;
  string local_50;
  VectorFixSize<3U> local_30;
  
  uVar2 = xmlNewChild(parent_element,0,"origin",0);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  in = (Position *)iDynTree::Transform::getPosition();
  bVar1 = vectorToString<iDynTree::Position>(in,&local_50);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  iDynTree::Transform::getRotation();
  iDynTree::Rotation::asRPY();
  if (bVar1) {
    bVar1 = vectorToString<iDynTree::VectorFixSize<3u>>(&local_30,&local_70);
  }
  else {
    bVar1 = false;
  }
  xmlNewProp(uVar2,"xyz",local_50._M_dataplus._M_p);
  xmlNewProp(uVar2,"rpy",local_70._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  return bVar1;
}

Assistant:

bool exportTransform(const Transform &trans, xmlNodePtr parent_element)
{
    bool ok = true;
    xmlNodePtr origin = xmlNewChild(parent_element, NULL, BAD_CAST "origin", NULL);
    std::string pose_xyz_str;
    ok = ok && vectorToString(trans.getPosition(), pose_xyz_str);
    std::string pose_rpy_str;
    Vector3 pose_rpy = trans.getRotation().asRPY();
    ok = ok && vectorToString(pose_rpy, pose_rpy_str);
    xmlNewProp(origin, BAD_CAST "xyz", BAD_CAST pose_xyz_str.c_str());
    xmlNewProp(origin, BAD_CAST "rpy", BAD_CAST pose_rpy_str.c_str());
    return ok;
}